

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

MSize snapshot_slots(jit_State *J,SnapEntry *map,BCReg nslots)

{
  ushort uVar1;
  uint uVar2;
  IRIns *pIVar3;
  IRIns *ir;
  SnapEntry sn;
  IRRef ref;
  TRef tr;
  MSize n;
  BCReg s;
  IRRef retf;
  BCReg nslots_local;
  SnapEntry *map_local;
  jit_State *J_local;
  
  uVar1 = J->chain[0xb];
  n = 0;
  s = 0;
  do {
    if (nslots <= s) {
      return n;
    }
    uVar2 = J->slot[s] & 0xffff;
    if (uVar2 != 0) {
      sn = s * 0x1000000 + (J->slot[s] & 0x3ffff);
      pIVar3 = (J->cur).ir + uVar2;
      if (((((sn & 0x30000) == 0) && ((pIVar3->field_1).o == 'F')) && ((pIVar3->field_0).op1 == s))
         && (uVar1 < uVar2)) {
        if (((pIVar3->field_0).op2 & 0x20) == 0) goto LAB_0018cdfa;
        if (((pIVar3->field_0).op2 & 0x11) != 1) {
          sn = sn | 0x40000;
        }
      }
      map[n] = sn;
      n = n + 1;
    }
LAB_0018cdfa:
    s = s + 1;
  } while( true );
}

Assistant:

static MSize snapshot_slots(jit_State *J, SnapEntry *map, BCReg nslots)
{
  IRRef retf = J->chain[IR_RETF];  /* Limits SLOAD restore elimination. */
  BCReg s;
  MSize n = 0;
  for (s = 0; s < nslots; s++) {
    TRef tr = J->slot[s];
    IRRef ref = tref_ref(tr);
#if LJ_FR2
    if (s == 1) {  /* Ignore slot 1 in LJ_FR2 mode, except if tailcalled. */
      if ((tr & TREF_FRAME))
	map[n++] = SNAP(1, SNAP_FRAME | SNAP_NORESTORE, REF_NIL);
      continue;
    }
    if ((tr & (TREF_FRAME | TREF_CONT)) && !ref) {
      cTValue *base = J->L->base - J->baseslot;
      tr = J->slot[s] = (tr & 0xff0000) | lj_ir_k64(J, IR_KNUM, base[s].u64);
      ref = tref_ref(tr);
    }
#endif
    if (ref) {
      SnapEntry sn = SNAP_TR(s, tr);
      IRIns *ir = &J->cur.ir[ref];
      if ((LJ_FR2 || !(sn & (SNAP_CONT|SNAP_FRAME))) &&
	  ir->o == IR_SLOAD && ir->op1 == s && ref > retf) {
	/*
	** No need to snapshot unmodified non-inherited slots.
	** But always snapshot the function below a frame in LJ_FR2 mode.
	*/
	if (!(ir->op2 & IRSLOAD_INHERIT) &&
	    (!LJ_FR2 || s == 0 || s+1 == nslots ||
	     !(J->slot[s+1] & (TREF_CONT|TREF_FRAME))))
	  continue;
	/* No need to restore readonly slots and unmodified non-parent slots. */
	if (!(LJ_DUALNUM && (ir->op2 & IRSLOAD_CONVERT)) &&
	    (ir->op2 & (IRSLOAD_READONLY|IRSLOAD_PARENT)) != IRSLOAD_PARENT)
	  sn |= SNAP_NORESTORE;
      }
      if (LJ_SOFTFP32 && irt_isnum(ir->t))
	sn |= SNAP_SOFTFPNUM;
      map[n++] = sn;
    }
  }
  return n;
}